

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O1

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,unsigned_int,void,supermap::Key<1ul>>
::find(SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,unsigned_int,void,supermap::Key<1ul>>
       *this)

{
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
  *in_RCX;
  Key<1UL> *in_RDX;
  long in_RSI;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
  *in_R8;
  
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void,_supermap::Key<1UL>_>
  ::find((optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> *)this,
         (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void,_supermap::Key<1UL>_>
          *)(in_RSI + -0x30),in_RDX,in_RCX,in_R8);
  return;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }